

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::InsertionOrderIndex>::insert
          (Table<unsigned_int,_kj::InsertionOrderIndex> *this,StringPtr *row)

{
  bool bVar1;
  uint skip;
  size_t pos;
  StringPtr *pSVar2;
  Maybe<unsigned_long> local_28;
  StringPtr *local_18;
  StringPtr *row_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  local_18 = row;
  row_local = (StringPtr *)this;
  pos = Vector<unsigned_int>::size((Vector<unsigned_int> *)this);
  pSVar2 = local_18;
  skip = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&local_28,
             (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,pSVar2,skip);
  bVar1 = Maybe<unsigned_long>::operator==(&local_28);
  Maybe<unsigned_long>::~Maybe(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pSVar2 = (StringPtr *)mv<unsigned_int>((uint *)local_18);
    pSVar2 = Vector<unsigned_int>::add<unsigned_int>((Vector<unsigned_int> *)this,pSVar2);
    return pSVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}